

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  code *pcVar7;
  undefined1 *puVar8;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  undefined1 auStack_598 [264];
  uv_stream_t *puStack_490;
  undefined1 auStack_480 [264];
  uv_stream_t *puStack_378;
  undefined1 auStack_368 [264];
  uv_stream_t *puStack_260;
  code *pcStack_258;
  undefined1 auStack_250 [264];
  undefined1 auStack_148 [264];
  uv_stream_t *puStack_40;
  long local_30;
  long local_28;
  undefined1 local_20 [16];
  
  local_20._0_8_ = nread;
  if (nread < 0) {
    local_30 = -0xfff;
    if (nread == -0xfff) {
      puStack_40 = (uv_stream_t *)0x170c5d;
      puts("got EOF");
      puStack_40 = (uv_stream_t *)0x170c65;
      free(buf->base);
      uv_close(stream,ponger_on_close);
      return;
    }
  }
  else {
    if (nread != 0) {
      lVar2 = 0;
      do {
        if (buf->base[lVar2] == 'I') {
          buf->base[lVar2] = 'O';
        }
        lVar2 = lVar2 + 1;
      } while (nread != lVar2);
    }
    puStack_40 = (uv_stream_t *)0x170bda;
    local_20 = uv_buf_init(buf->base);
    puStack_40 = (uv_stream_t *)0x170bee;
    pvVar3 = malloc(0xc0);
    if (pvVar3 == (void *)0x0) {
      puStack_40 = (uv_stream_t *)0x170c80;
      ponger_read_cb_cold_2();
    }
    else {
      local_30 = 0;
      puStack_40 = (uv_stream_t *)0x170c1c;
      iVar1 = uv_write(pvVar3,stream,local_20,1,pinger_after_write);
      local_28 = (long)iVar1;
      if (local_30 == local_28) {
        return;
      }
    }
    puStack_40 = (uv_stream_t *)0x170c8f;
    ponger_read_cb_cold_1();
  }
  puStack_40 = (uv_stream_t *)0x170c9e;
  ponger_read_cb_cold_3();
  puVar8 = auStack_250;
  puVar5 = auStack_250;
  pcStack_258 = (code *)0x170cad;
  puStack_40 = stream;
  puVar4 = (undefined1 *)uv_default_loop();
  pcStack_258 = (code *)0x170cbf;
  iVar1 = uv_pipe_init(puVar4,auStack_148,0);
  if (iVar1 == 0) {
    puVar4 = auStack_148;
    pcStack_258 = (code *)0x170cdb;
    iVar1 = uv_pipe_bind(puVar4,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00170dcc;
    pcStack_258 = (code *)0x170ce8;
    puVar4 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170cf5;
    iVar1 = uv_pipe_init(puVar4,auStack_250,0);
    if (iVar1 != 0) goto LAB_00170dd1;
    pcStack_258 = (code *)0x170d0c;
    iVar1 = uv_pipe_bind(auStack_250,"/tmp/uv-test-sock");
    if (iVar1 != -0x62) goto LAB_00170dd6;
    puVar8 = auStack_148;
    pcStack_258 = (code *)0x170d29;
    iVar1 = uv_listen(puVar8,0x1000,0);
    if (iVar1 != 0) goto LAB_00170ddb;
    pcStack_258 = (code *)0x170d40;
    iVar1 = uv_listen(auStack_250,0x1000,0);
    if (iVar1 != -0x16) goto LAB_00170de0;
    pcVar7 = close_cb;
    pcStack_258 = (code *)0x170d60;
    uv_close(auStack_148,close_cb);
    pcStack_258 = (code *)0x170d6b;
    uv_close(auStack_250,close_cb);
    pcStack_258 = (code *)0x170d70;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170d7a;
    uv_run(puVar5,0);
    if (close_cb_called != 2) goto LAB_00170de5;
    pcStack_258 = (code *)0x170d88;
    pcVar7 = (code *)uv_default_loop();
    pcStack_258 = (code *)0x170d9c;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_258 = (code *)0x170da6;
    uv_run(pcVar7,0);
    pcStack_258 = (code *)0x170dab;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170db3;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_258 = (code *)0x170dbc;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_258 = (code *)0x170dcc;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_00170dcc:
    pcStack_258 = (code *)0x170dd1;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_00170dd1:
    puVar8 = puVar4;
    pcStack_258 = (code *)0x170dd6;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_00170dd6:
    pcStack_258 = (code *)0x170ddb;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_00170ddb:
    puVar5 = puVar8;
    pcStack_258 = (code *)0x170de0;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_00170de0:
    pcStack_258 = (code *)0x170de5;
    run_test_pipe_bind_error_addrinuse_cold_6();
    pcVar7 = (code *)stream;
LAB_00170de5:
    pcStack_258 = (code *)0x170dea;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_258 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (puVar5 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_260 = (uv_stream_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_378 = (uv_stream_t *)0x170e0e;
  puStack_260 = (uv_stream_t *)pcVar7;
  uVar6 = uv_default_loop();
  puStack_378 = (uv_stream_t *)0x170e1d;
  iVar1 = uv_pipe_init(uVar6,auStack_368,0);
  if (iVar1 == 0) {
    puStack_378 = (uv_stream_t *)0x170e36;
    iVar1 = uv_pipe_bind(auStack_368,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 != -0xd) goto LAB_00170ead;
    puStack_378 = (uv_stream_t *)0x170e4c;
    uv_close(auStack_368,close_cb);
    puStack_378 = (uv_stream_t *)0x170e51;
    uVar6 = uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170e5b;
    uv_run(uVar6,0);
    if (close_cb_called != 1) goto LAB_00170eb2;
    puStack_378 = (uv_stream_t *)0x170e69;
    pcVar7 = (code *)uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170e7d;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_378 = (uv_stream_t *)0x170e87;
    uv_run(pcVar7,0);
    puStack_378 = (uv_stream_t *)0x170e8c;
    uVar6 = uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170e94;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      puStack_378 = (uv_stream_t *)0x170e9d;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_378 = (uv_stream_t *)0x170ead;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_00170ead:
    puStack_378 = (uv_stream_t *)0x170eb2;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_00170eb2:
    puStack_378 = (uv_stream_t *)0x170eb7;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_378 = (uv_stream_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_490 = (uv_stream_t *)0x170ec9;
  puStack_378 = (uv_stream_t *)pcVar7;
  uVar6 = uv_default_loop();
  puStack_490 = (uv_stream_t *)0x170ed8;
  iVar1 = uv_pipe_init(uVar6,auStack_480,0);
  if (iVar1 == 0) {
    puStack_490 = (uv_stream_t *)0x170ef1;
    iVar1 = uv_pipe_bind(auStack_480,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00170f81;
    puStack_490 = (uv_stream_t *)0x170f0a;
    iVar1 = uv_pipe_bind(auStack_480,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_00170f86;
    puStack_490 = (uv_stream_t *)0x170f20;
    uv_close(auStack_480,close_cb);
    puStack_490 = (uv_stream_t *)0x170f25;
    uVar6 = uv_default_loop();
    puStack_490 = (uv_stream_t *)0x170f2f;
    uv_run(uVar6,0);
    if (close_cb_called != 1) goto LAB_00170f8b;
    puStack_490 = (uv_stream_t *)0x170f3d;
    pcVar7 = (code *)uv_default_loop();
    puStack_490 = (uv_stream_t *)0x170f51;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_490 = (uv_stream_t *)0x170f5b;
    uv_run(pcVar7,0);
    puStack_490 = (uv_stream_t *)0x170f60;
    uVar6 = uv_default_loop();
    puStack_490 = (uv_stream_t *)0x170f68;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      puStack_490 = (uv_stream_t *)0x170f71;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_490 = (uv_stream_t *)0x170f81;
    run_test_pipe_bind_error_inval_cold_1();
LAB_00170f81:
    puStack_490 = (uv_stream_t *)0x170f86;
    run_test_pipe_bind_error_inval_cold_2();
LAB_00170f86:
    puStack_490 = (uv_stream_t *)0x170f8b;
    run_test_pipe_bind_error_inval_cold_3();
LAB_00170f8b:
    puStack_490 = (uv_stream_t *)0x170f90;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_490 = (uv_stream_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_490 = (uv_stream_t *)pcVar7;
  puVar4 = (undefined1 *)uv_default_loop();
  iVar1 = uv_pipe_init(puVar4,auStack_598,0);
  if (iVar1 == 0) {
    puVar4 = auStack_598;
    iVar1 = uv_listen(puVar4,0x1000,0);
    if (iVar1 != -0x16) goto LAB_00171041;
    uv_close(auStack_598,close_cb);
    puVar4 = (undefined1 *)uv_default_loop();
    uv_run(puVar4,0);
    if (close_cb_called == 1) {
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0017104b;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_00171041:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_0017104b:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar4,0);
  return;
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  ASSERT_EQ(0, uv_write(req, stream, &writebuf, 1, pinger_after_write));
}